

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
          (ValueFunctionDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *p,
          JointPolicyDiscretePure *jp)

{
  size_t sVar1;
  
  (this->super_ValueFunction)._vptr_ValueFunction =
       (_func_int **)&PTR__ValueFunctionDecPOMDPDiscrete_005a1ce0;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.current_ = false;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .bucket_count_ = 0x10;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .size_ = 0;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .mlf_ = 1.0;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .max_load_ = 0;
  (this->_m_cache).table_.
  super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  .buckets_ = (bucket_pointer)0x0;
  this->_m_planningUnitDecPOMDPDiscrete = p;
  this->_m_jointPolicyDiscretePure = jp;
  this->_m_pu = p;
  this->_m_jpol = jp;
  this->_m_nrJOH = (p->super_PlanningUnitMADPDiscrete)._m_nrJointObservationHistories;
  sVar1 = (**(code **)((long)*(p->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  this->_m_nrJO = sVar1;
  sVar1 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  this->_m_nrS = sVar1;
  this->_m_h = (this->_m_pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  return;
}

Assistant:

ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete(
    PlanningUnitDecPOMDPDiscrete* p , JointPolicyDiscretePure* jp):
    _m_planningUnitDecPOMDPDiscrete(p), //BAS is never used, _m_pu used instead
    _m_jointPolicyDiscretePure(jp)
{
    _m_pu = p;
    _m_jpol = jp;
    _m_nrJOH = _m_pu->GetNrJointObservationHistories();
    _m_nrJO = _m_pu->GetNrJointObservations();
    _m_nrS =  _m_pu->GetNrStates();
    _m_h = _m_pu->GetHorizon();

}